

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep_coefficients.c
# Opt level: O1

SplittingStepCoefficients SplittingStepCoefficients_SymmetricParallel(int partitions)

{
  sunrealtype *psVar1;
  sunrealtype **ppsVar2;
  sunrealtype *psVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  SplittingStepCoefficients pSVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  uVar4 = (ulong)(uint)partitions;
  pSVar7 = SplittingStepCoefficients_Alloc(2,partitions,partitions);
  if (pSVar7 == (SplittingStepCoefficients)0x0) {
    pSVar7 = (SplittingStepCoefficients)0x0;
  }
  else {
    pSVar7->order = 2;
    psVar1 = pSVar7->alpha;
    *psVar1 = 0.5;
    psVar1[1] = 0.5;
    auVar6 = _DAT_001833d0;
    auVar5 = _DAT_001833c0;
    if (0 < partitions) {
      ppsVar2 = pSVar7->beta[1];
      psVar1 = (*pSVar7->beta)[uVar4];
      iVar8 = partitions + -1;
      uVar9 = 0;
      do {
        lVar11 = (long)iVar8;
        uVar10 = lVar11 + 1U;
        if ((long)(lVar11 + 1U) <= (long)uVar4) {
          uVar10 = uVar4;
        }
        psVar1[uVar9] = 1.0;
        uVar12 = (ulong)(int)(~(uint)uVar9 + partitions);
        uVar14 = uVar12 + 1;
        if ((long)uVar14 <= (long)uVar4) {
          uVar14 = uVar4;
        }
        psVar3 = ppsVar2[uVar9 + 1];
        lVar13 = ~uVar12 + uVar14;
        auVar15._8_4_ = (int)lVar13;
        auVar15._0_8_ = lVar13;
        auVar15._12_4_ = (int)((ulong)lVar13 >> 0x20);
        auVar15 = auVar15 ^ auVar6;
        uVar14 = 0;
        do {
          auVar16._8_4_ = (int)uVar14;
          auVar16._0_8_ = uVar14;
          auVar16._12_4_ = (int)(uVar14 >> 0x20);
          auVar16 = (auVar16 | auVar5) ^ auVar6;
          if ((bool)(~(auVar16._4_4_ == auVar15._4_4_ && auVar15._0_4_ < auVar16._0_4_ ||
                      auVar15._4_4_ < auVar16._4_4_) & 1)) {
            psVar3[lVar11 + uVar14] = 1.0;
          }
          if ((auVar16._12_4_ != auVar15._12_4_ || auVar16._8_4_ <= auVar15._8_4_) &&
              auVar16._12_4_ <= auVar15._12_4_) {
            psVar3[lVar11 + uVar14 + 1] = 1.0;
          }
          uVar14 = uVar14 + 2;
        } while (((uVar10 - lVar11) + 1 & 0xfffffffffffffffe) != uVar14);
        uVar9 = uVar9 + 1;
        iVar8 = iVar8 + -1;
      } while (uVar9 != uVar4);
    }
  }
  return pSVar7;
}

Assistant:

SplittingStepCoefficients SplittingStepCoefficients_SymmetricParallel(
  const int partitions)
{
  const SplittingStepCoefficients coefficients =
    SplittingStepCoefficients_Alloc(2, partitions, partitions);
  if (coefficients == NULL) { return NULL; }

  coefficients->order    = 2;
  coefficients->alpha[0] = SUN_RCONST(0.5);
  coefficients->alpha[1] = SUN_RCONST(0.5);

  for (int i = 0; i < partitions; i++)
  {
    coefficients->beta[0][partitions][i] = SUN_RCONST(1.0);
    for (int j = partitions - i - 1; j < partitions; j++)
    {
      coefficients->beta[1][i + 1][j] = SUN_RCONST(1.0);
    }
  }

  return coefficients;
}